

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void __thiscall
NodeParser::parseTankReact
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  InputError *this_00;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  Tank *tank;
  string *tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Node *node_local;
  NodeParser *this_local;
  
  tokens = (string *)tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)node;
  node_local = (Node *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (1 < sVar3) {
    tank = (Tank *)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)tokens,0);
    iVar2 = (**(code **)((tokenList_local->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 0x10))();
    if (iVar2 == 1) {
      local_30 = tokenList_local;
      bVar1 = Utilities::parseNumber<double>
                        ((string *)&(tank->super_Node).yCoord,
                         (double *)
                         &tokenList_local[7].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        this_00 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_50,(string *)&(tank->super_Node).yCoord);
        InputError::InputError(this_00,6,(string *)local_50);
        __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
      }
    }
  }
  return;
}

Assistant:

void NodeParser::parseTankReact(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - TANK keyword
    // 1 - tank ID
    // 2 - reaction coeff. (1/days)

    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];

    // ... cast Node to Tank

    if ( node->type() != Node::TANK ) return;
    Tank* tank = static_cast<Tank*>(node);

    // ... read reaction coefficient in 1/days

    if ( !Utilities::parseNumber(tokens[2], tank->bulkCoeff) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }
}